

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O1

void * Sat_ProofCore(sat_solver2 *s)

{
  int iVar1;
  int iVar2;
  Prf_Man_t *pPVar3;
  Vec_Wrd_t *pVVar4;
  int iVar5;
  void *pvVar6;
  Vec_Int_t *p;
  int *piVar7;
  Vec_Int_t *pVVar8;
  uint uVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  
  if (s->pPrf1 != (Vec_Set_t *)0x0) {
    pvVar6 = Proof_DeriveCore(s->pPrf1,s->hProofLast);
    return pvVar6;
  }
  pPVar3 = s->pPrf2;
  if (pPVar3 == (Prf_Man_t *)0x0) {
    p = (Vec_Int_t *)0x0;
  }
  else {
    pVVar4 = pPVar3->vInfo;
    dVar12 = 0.0;
    dVar11 = 0.0;
    if (pVVar4 != (Vec_Wrd_t *)0x0) {
      dVar11 = (double)pVVar4->nCap * 8.0 + 16.0;
    }
    if (pPVar3->vSaved != (Vec_Int_t *)0x0) {
      dVar12 = (double)pPVar3->vSaved->nCap * 4.0 + 16.0;
    }
    dVar12 = dVar11 + dVar12 + 48.0;
    dVar11 = s->dPrfMemory;
    if (s->dPrfMemory <= dVar12) {
      dVar11 = dVar12;
    }
    s->dPrfMemory = dVar11;
    if (pPVar3->iFirst < 0) {
      __assert_fail("p->iFirst >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                    ,0x123,"Vec_Int_t *Prf_ManUnsatCore(Prf_Man_t *)");
    }
    if (pPVar3->pInfo != (word *)0x0) {
      __assert_fail("p->pInfo == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                    ,0x124,"Vec_Int_t *Prf_ManUnsatCore(Prf_Man_t *)");
    }
    iVar1 = pVVar4->nSize;
    iVar2 = pPVar3->nWords;
    iVar5 = iVar1 / iVar2;
    if (iVar5 < 1) {
      __assert_fail("Prf_ManSize(p) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                    ,0x125,"Vec_Int_t *Prf_ManUnsatCore(Prf_Man_t *)");
    }
    p = (Vec_Int_t *)malloc(0x10);
    p->nSize = 0;
    p->nCap = iVar2 << 6;
    piVar7 = (int *)malloc((long)iVar2 << 8);
    p->pArray = piVar7;
    uVar9 = (iVar5 + -1) * iVar2;
    if (((int)uVar9 < 0) || (iVar1 <= (int)uVar9)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                    ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
    }
    pPVar3->pInfo = pVVar4->pArray + uVar9;
    pVVar8 = pPVar3->vId2Pr;
    if (pVVar8 == (Vec_Int_t *)0x0) {
      if (0 < iVar2) {
        uVar9 = 0;
        do {
          if ((*(uint *)((long)pPVar3->pInfo + (ulong)(uVar9 >> 5) * 4) >> (uVar9 & 0x1f) & 1) != 0)
          {
            Vec_IntPush(p,uVar9);
          }
          uVar9 = uVar9 + 1;
        } while ((int)uVar9 < pPVar3->nWords * 0x40);
      }
    }
    else if (0 < pVVar8->nSize) {
      lVar10 = 0;
      do {
        uVar9 = pVVar8->pArray[lVar10];
        if (-1 < (int)uVar9) {
          if (pPVar3->nWords * 0x40 <= (int)uVar9) {
            __assert_fail("Entry < 64 * p->nWords",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                          ,0x134,"Vec_Int_t *Prf_ManUnsatCore(Prf_Man_t *)");
          }
          if ((*(uint *)((long)pPVar3->pInfo + (ulong)(uVar9 >> 5) * 4) >> (uVar9 & 0x1f) & 1) != 0)
          {
            Vec_IntPush(p,(int)lVar10);
          }
        }
        lVar10 = lVar10 + 1;
        pVVar8 = pPVar3->vId2Pr;
      } while (lVar10 < pVVar8->nSize);
    }
    pPVar3->pInfo = (word *)0x0;
    qsort(p->pArray,(long)p->nSize,4,Vec_IntSortCompare2);
  }
  return p;
}

Assistant:

void * Sat_ProofCore( sat_solver2 * s )
{
    extern void * Proof_DeriveCore( Vec_Set_t * vProof, int hRoot );
    if ( s->pPrf1 )
        return Proof_DeriveCore( s->pPrf1, s->hProofLast );
    if ( s->pPrf2 )
    {
        s->dPrfMemory = Abc_MaxDouble( s->dPrfMemory, Prf_ManMemory(s->pPrf2) );
        return Prf_ManUnsatCore( s->pPrf2 );
    }
    return NULL;
}